

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.capnp.h
# Opt level: O2

void __thiscall capnp::compiler::Expression::Builder::setString(Builder *this,Reader value)

{
  PointerBuilder local_18;
  
  *(undefined2 *)(this->_builder).data = 4;
  local_18.pointer = (this->_builder).pointers;
  local_18.segment = (this->_builder).segment;
  local_18.capTable = (this->_builder).capTable;
  capnp::_::PointerBuilder::setBlob<capnp::Text>(&local_18,value);
  return;
}

Assistant:

inline void Expression::Builder::setString( ::capnp::Text::Reader value) {
  _builder.setDataField<Expression::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Expression::STRING);
  ::capnp::_::PointerHelpers< ::capnp::Text>::set(_builder.getPointerField(
      ::capnp::bounded<0>() * ::capnp::POINTERS), value);
}